

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O2

void ImGuizmo::ComputeSnap(float *value,float snap)

{
  float fVar1;
  
  if (1.1920929e-07 < snap) {
    fVar1 = fmodf(*value,snap);
    if (0.5 <= ABS(fVar1) / snap) {
      if (ABS(fVar1) / snap <= 0.5) {
        return;
      }
      fVar1 = snap * *(float *)(&DAT_001929fc + (ulong)(*value < 0.0) * 4) + (*value - fVar1);
    }
    else {
      fVar1 = *value - fVar1;
    }
    *value = fVar1;
  }
  return;
}

Assistant:

static void ComputeSnap(float*value, float snap)
   {
      if (snap <= FLT_EPSILON)
         return;
      float modulo = fmodf(*value, snap);
      float moduloRatio = fabsf(modulo) / snap;
      if (moduloRatio < snapTension)
         *value -= modulo;
      else if (moduloRatio >(1.f - snapTension))
         *value = *value - modulo + snap * ((*value<0.f) ? -1.f : 1.f);
   }